

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

void recvCompleteCallback
               (void *context,CONTROL_PACKET_TYPE packet,int flags,BUFFER_HANDLE headerData)

{
  byte *pbVar1;
  byte *__src;
  uint16_t uVar2;
  int iVar3;
  byte *pbVar4;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  STRING_HANDLE pSVar5;
  long lVar6;
  BUFFER_HANDLE handle;
  size_t length;
  uchar *data;
  code *pcVar7;
  MQTT_MESSAGE_HANDLE handle_00;
  undefined8 uVar8;
  char *pcVar9;
  byte bVar10;
  uint uVar11;
  undefined8 *puVar12;
  byte bVar13;
  long lVar14;
  undefined8 uVar15;
  char *pcVar16;
  char *pcVar17;
  QOS_VALUE QVar18;
  ulong __n;
  uint8_t *iterator;
  SUBSCRIBE_ACK suback;
  STRING_HANDLE local_70;
  byte *local_68;
  QOS_VALUE local_5c;
  undefined8 local_58;
  char *pcStack_50;
  long local_48;
  undefined8 local_38;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
               ,"recvCompleteCallback",0x3f1,1,"recvCompleteCallback context failed.");
    return;
  }
  local_68 = (byte *)0x0;
  if (headerData == (BUFFER_HANDLE)0x0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    pbVar4 = (byte *)BUFFER_length(headerData);
    local_68 = BUFFER_u_char(headerData);
  }
  pbVar1 = local_68;
  if ((packet != PINGRESP_TYPE) && (local_68 == (byte *)0x0 || pbVar4 == (byte *)0x0)) {
    return;
  }
  switch(packet << 0x1c | (uint)(packet + 0xffffffe0) >> 4) {
  case PACKET_INVALID1_TYPE:
    local_58 = (byte *)0x0;
    if (pbVar4 == (byte *)0x2) {
      bVar13 = *local_68;
      if (bVar13 < 2) {
        pbVar4 = local_68 + 1;
        local_68 = local_68 + 2;
        bVar10 = 6;
        if (*pbVar4 < 6) {
          bVar10 = *pbVar4;
        }
        local_58._0_4_ = (uint)(bVar13 == 1);
        local_58 = (byte *)(ulong)CONCAT14(bVar10,(uint)local_58);
        if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
          pcVar16 = "false";
          if (bVar13 == 1) {
            pcVar16 = "true";
          }
          pSVar5 = STRING_construct_sprintf
                             ("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x",pcVar16);
          log_incoming_trace((MQTT_CLIENT *)(ulong)*(ushort *)((long)context + 0xa2),pSVar5);
          STRING_delete(pSVar5);
        }
        (**(code **)((long)context + 0x28))
                  (context,1,&local_58,*(undefined8 *)((long)context + 0x38));
        if (local_58._4_4_ != 0) {
          return;
        }
        *(byte *)((long)context + 0xa0) = *(byte *)((long)context + 0xa0) | 1;
        return;
      }
      local_68 = local_68 + 1;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "Invalid CONNACK packet.";
        iVar3 = 0x32b;
LAB_001122bf:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                   ,"recvCompleteCallback",iVar3,1,pcVar16);
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "Invalid CONNACK packet.";
        iVar3 = 0x323;
        goto LAB_001122bf;
      }
    }
    break;
  case 1:
    QVar18 = (uint)((flags & 2U) == 0) + DELIVER_AT_LEAST_ONCE;
    if (flags == 0) {
      QVar18 = DELIVER_AT_MOST_ONCE;
    }
    local_58 = local_68;
    uVar2 = byteutil_read_uint16((uint8_t **)&local_58,(size_t)pbVar4);
    __src = local_58;
    if ((uVar2 == 0) || (__n = (ulong)uVar2, pbVar4 < local_58 + (__n - (long)pbVar1))) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "String passed not a valid UTF.";
        iVar3 = 0xbd;
LAB_001124c3:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                   ,"byteutil_readUTF",iVar3,1,pcVar16);
      }
    }
    else {
      local_38 = __n + 1;
      local_5c = QVar18;
      pcVar16 = (char *)malloc(local_38);
      if (pcVar16 != (char *)0x0) {
        local_38 = CONCAT44(local_38._4_4_,flags) & 0xffffffff00000001;
        memcpy(pcVar16,__src,__n);
        pcVar16[__n] = '\0';
        local_58 = __src + __n;
        if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
          pSVar5 = (STRING_HANDLE)0x0;
        }
        else {
          pcVar17 = "false";
          if ((flags & 8U) != 0) {
            pcVar17 = "true";
          }
          lVar14 = 0;
          pcVar9 = "NULL";
          do {
            if (*(QOS_VALUE *)((long)&QOS_VALUE_ValuesAndStrings[0].value + lVar14) == local_5c) {
              pcVar9 = *(char **)((long)&QOS_VALUE_ValuesAndStrings[0].valueAsString + lVar14);
              break;
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x40);
          pSVar5 = STRING_construct_sprintf
                             ("PUBLISH | IS_DUP: %s | RETAIN: %d | QOS: %s | TOPIC_NAME: %s",pcVar17
                              ,local_38 & 0xffffffff,pcVar9,pcVar16);
        }
        if (flags == 0) {
          uVar2 = 0;
LAB_00112ab5:
          lVar14 = (long)pbVar1 - (long)local_58;
          handle_00 = mqttmessage_create_in_place
                                (uVar2,pcVar16,local_5c,local_58,(size_t)(pbVar4 + lVar14));
          if (handle_00 == (MQTT_MESSAGE_HANDLE)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar17 = "failure in mqttmessage_create";
              iVar3 = 0x2e4;
LAB_00112b55:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                         ,"ProcessPublishMessage",iVar3,1,pcVar17);
            }
LAB_00112b60:
            if (*(code **)((long)context + 0x40) != (code *)0x0) {
              (**(code **)((long)context + 0x40))(context,3,*(undefined8 *)((long)context + 0x48));
            }
            close_connection((MQTT_CLIENT *)context);
          }
          else {
            iVar3 = mqttmessage_setIsDuplicateMsg(handle_00,SUB41((flags & 8U) >> 3,0));
            if ((iVar3 != 0) ||
               (iVar3 = mqttmessage_setIsRetained(handle_00,SUB81(local_38,0)), iVar3 != 0)) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar17 = "failure setting mqtt message property";
                iVar3 = 0x2ea;
                goto LAB_00112b55;
              }
              goto LAB_00112b60;
            }
            if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
              STRING_sprintf(pSVar5," | PAYLOAD_LEN: %lu",pbVar4 + lVar14);
              log_incoming_trace((MQTT_CLIENT *)(ulong)*(ushort *)((long)context + 0xa2),pSVar5);
            }
            iVar3 = (**(code **)((long)context + 0x30))
                              (handle_00,*(undefined8 *)((long)context + 0x38));
            if (iVar3 == 1) {
              SendMessageAck((MQTT_CLIENT *)context,uVar2,local_5c);
            }
          }
          mqttmessage_destroy(handle_00);
        }
        else {
          uVar2 = byteutil_read_uint16
                            ((uint8_t **)&local_58,(long)(pbVar4 + (long)pbVar1) - (long)local_58);
          if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
            STRING_sprintf(pSVar5," | PACKET_ID: %u",(ulong)uVar2);
          }
          if (uVar2 != 0) goto LAB_00112ab5;
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                       ,"ProcessPublishMessage",0x2da,1,"Publish MSG: packetId=0, invalid");
          }
          if (*(code **)((long)context + 0x40) != (code *)0x0) {
            (**(code **)((long)context + 0x40))(context,2,*(undefined8 *)((long)context + 0x48));
          }
          close_connection((MQTT_CLIENT *)context);
        }
        if (pSVar5 != (STRING_HANDLE)0x0) {
          STRING_delete(pSVar5);
        }
LAB_00112bec:
        free(pcVar16);
        return;
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "Cannot alloc memory, size:%zu";
        iVar3 = 0xb8;
        goto LAB_001124c3;
      }
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                 ,"ProcessPublishMessage",0x2be,1,"Publish MSG: failure reading topic name");
    }
    pcVar7 = *(code **)((long)context + 0x40);
    if (pcVar7 == (code *)0x0) goto LAB_001128e7;
    uVar8 = *(undefined8 *)((long)context + 0x48);
    uVar15 = 2;
    goto LAB_001128e5;
  case 2:
  case 3:
  case 4:
  case 5:
    if (pbVar4 == (byte *)0x2) {
      bVar13 = 2;
      if ((packet != PUBACK_TYPE) && (bVar13 = 3, packet != PUBREC_TYPE)) {
        bVar13 = packet == PUBREL_TYPE ^ 5;
      }
      uVar2 = byteutil_read_uint16(&local_68,2);
      local_58 = (byte *)CONCAT62(local_58._2_6_,uVar2);
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        if (packet == PUBACK_TYPE) {
          pcVar16 = "PUBACK";
        }
        else if (packet == PUBREC_TYPE) {
          pcVar16 = "PUBREC";
        }
        else {
          pcVar16 = "PUBCOMP";
          if (packet == PUBREL_TYPE) {
            pcVar16 = "PUBREL";
          }
        }
        pSVar5 = STRING_construct_sprintf("%s | PACKET_ID: %u",pcVar16,(ulong)uVar2);
        log_incoming_trace((MQTT_CLIENT *)(ulong)*(ushort *)((long)context + 0xa2),pSVar5);
        STRING_delete(pSVar5);
      }
      (**(code **)((long)context + 0x28))
                (context,bVar13,&local_58,*(undefined8 *)((long)context + 0x38));
      if (packet == PUBREL_TYPE) {
        handle = mqtt_codec_publishComplete((uint16_t)local_58);
        if (handle != (BUFFER_HANDLE)0x0) goto LAB_00112817;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar16 = "Failed to allocate publish complete message.";
          iVar3 = 0x379;
          goto LAB_001128c5;
        }
      }
      else {
        if (packet != PUBREC_TYPE) {
          return;
        }
        handle = mqtt_codec_publishRelease((uint16_t)local_58);
        if (handle != (BUFFER_HANDLE)0x0) {
LAB_00112817:
          length = BUFFER_length(handle);
          data = BUFFER_u_char(handle);
          iVar3 = sendPacketItem((MQTT_CLIENT *)context,data,length);
          if (iVar3 != 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                         ,"recvCompleteCallback",0x382,1,"Failed sending publish reply.");
            }
            if (*(code **)((long)context + 0x40) != (code *)0x0) {
              (**(code **)((long)context + 0x40))(context,4,*(undefined8 *)((long)context + 0x48));
            }
            close_connection((MQTT_CLIENT *)context);
          }
          BUFFER_delete(handle);
          return;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar16 = "Failed to allocate publish release message.";
          iVar3 = 0x370;
LAB_001128c5:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                     ,"recvCompleteCallback",iVar3,1,pcVar16);
        }
      }
      goto LAB_001128d0;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid packet length.";
      iVar3 = 0x352;
      goto LAB_001122bf;
    }
    break;
  default:
    goto switchD_00112234_caseD_6;
  case 7:
    local_58 = (uint8_t *)0x0;
    pcStack_50 = (char *)0x0;
    local_48 = 0;
    uVar2 = byteutil_read_uint16(&local_68,(size_t)pbVar4);
    local_58 = (byte *)CONCAT62(local_58._2_6_,uVar2);
    pbVar1 = pbVar4 + -2;
    if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
      local_70 = (STRING_HANDLE)0x0;
    }
    else {
      local_70 = STRING_construct_sprintf("SUBACK | PACKET_ID: %u",(ulong)uVar2);
    }
    if (((ulong)pbVar1 >> 0x3e == 0) &&
       (pcVar16 = (char *)malloc((long)pbVar1 * 4), pcStack_50 = pcVar16, pcVar16 != (char *)0x0)) {
      if (pbVar1 != (byte *)0x0) {
        lVar14 = 1;
        do {
          bVar13 = *local_68;
          uVar11 = (uint)bVar13;
          local_68 = local_68 + 1;
          if ((bVar13 & 0x7c) != 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                         ,"recvCompleteCallback",0x3a4,1,"Invalid SUBACK_TYPE packet.");
            }
            if (*(code **)((long)context + 0x40) != (code *)0x0) {
              (**(code **)((long)context + 0x40))(context,4,*(undefined8 *)((long)context + 0x48));
            }
            close_connection((MQTT_CLIENT *)context);
            break;
          }
          if (2 < bVar13) {
            uVar11 = 0x80;
          }
          *(uint *)(pcVar16 + lVar14 * 4 + -4) = uVar11;
          local_48 = lVar14;
          if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
            STRING_sprintf(local_70," | RETURN_CODE: %u");
          }
          lVar6 = lVar14 + (3 - (long)pbVar4);
          lVar14 = lVar14 + 1;
        } while (lVar6 != 1);
      }
      if ((*(ushort *)((long)context + 0xa2) & 1) != 0) {
        log_incoming_trace((MQTT_CLIENT *)(ulong)*(ushort *)((long)context + 0xa2),local_70);
        STRING_delete(local_70);
      }
      (**(code **)((long)context + 0x28))(context,6,&local_58,*(undefined8 *)((long)context + 0x38))
      ;
      pcVar16 = pcStack_50;
      goto LAB_00112bec;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar16 = "allocation of quality of service value failed, size:%zu";
      iVar3 = 0x3c0;
      goto LAB_001128c5;
    }
LAB_001128d0:
    pcVar7 = *(code **)((long)context + 0x40);
    if (pcVar7 != (code *)0x0) {
      uVar8 = *(undefined8 *)((long)context + 0x48);
      uVar15 = 3;
      goto LAB_001128e5;
    }
    goto LAB_001128e7;
  case 9:
    if (pbVar4 == (byte *)0x2) {
      uVar2 = byteutil_read_uint16(&local_68,2);
      local_58 = (byte *)CONCAT62(local_58._2_6_,uVar2);
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        pSVar5 = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %u",(ulong)uVar2);
        log_incoming_trace((MQTT_CLIENT *)(ulong)*(ushort *)((long)context + 0xa2),pSVar5);
        STRING_delete(pSVar5);
      }
      uVar8 = *(undefined8 *)((long)context + 0x38);
      puVar12 = &local_58;
      uVar15 = 7;
      goto LAB_0011256a;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid UNSUBACK packet length.";
      iVar3 = 0x3cb;
      goto LAB_001122bf;
    }
    break;
  case 0xb:
    *(undefined8 *)((long)context + 0xa8) = 0;
    if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
      pSVar5 = STRING_construct_sprintf("PINGRESP");
      log_incoming_trace((MQTT_CLIENT *)(ulong)*(ushort *)((long)context + 0xa2),pSVar5);
      STRING_delete(pSVar5);
    }
    uVar8 = *(undefined8 *)((long)context + 0x38);
    uVar15 = 8;
    puVar12 = (undefined8 *)0x0;
LAB_0011256a:
    (**(code **)((long)context + 0x28))(context,uVar15,puVar12,uVar8);
    goto switchD_00112234_caseD_6;
  }
  pcVar7 = *(code **)((long)context + 0x40);
  if (pcVar7 != (code *)0x0) {
    uVar8 = *(undefined8 *)((long)context + 0x48);
    uVar15 = 4;
LAB_001128e5:
    (*pcVar7)(context,uVar15,uVar8);
  }
LAB_001128e7:
  close_connection((MQTT_CLIENT *)context);
switchD_00112234_caseD_6:
  return;
}

Assistant:

static void recvCompleteCallback(void* context, CONTROL_PACKET_TYPE packet, int flags, BUFFER_HANDLE headerData)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        size_t packetLength = 0;
        uint8_t* iterator = NULL;
        if (headerData != NULL)
        {
            packetLength = BUFFER_length(headerData);
            iterator = BUFFER_u_char(headerData);
        }

#ifdef ENABLE_RAW_TRACE
        logIncomingRawTrace(mqtt_client, packet, (uint8_t)flags, iterator, packetLength);
#endif
        if ((iterator != NULL && packetLength > 0) || packet == PINGRESP_TYPE)
        {
            switch (packet)
            {
                case CONNACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_028: [If the actionResult parameter is of type CONNECT_ACK then the msgInfo value shall be a CONNECT_ACK structure.]*/
                    CONNECT_ACK connack = { 0 };
                    if (packetLength != 2) // CONNACK payload must be only 2 bytes
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    uint8_t connect_acknowledge_flags = byteutil_readByte(&iterator);
                    if (connect_acknowledge_flags & 0xFE) // bits 7-1 must be zero
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    connack.isSessionPresent = (connect_acknowledge_flags == 0x1) ? true : false;
                    uint8_t rc = byteutil_readByte(&iterator);
                    connack.returnCode =
                        (rc < ((uint8_t)CONN_REFUSED_UNKNOWN)) ?
                        (CONNECT_RETURN_CODE)rc : CONN_REFUSED_UNKNOWN;

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x", connack.isSessionPresent ? TRUE_CONST : FALSE_CONST, connack.returnCode);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_CONNACK, (void*)&connack, mqtt_client->ctx);

                    if (connack.returnCode == CONNECTION_ACCEPTED)
                    {
                        mqtt_client->mqtt_status |= MQTT_STATUS_CLIENT_CONNECTED;
                    }
                    break;
                }
                case PUBLISH_TYPE:
                {
                    ProcessPublishMessage(mqtt_client, iterator, packetLength, flags);
                    break;
                }
                case PUBACK_TYPE:
                case PUBREC_TYPE:
                case PUBREL_TYPE:
                case PUBCOMP_TYPE:
                {
                    if (packetLength != 2) // PUBXXX payload must be only 2 bytes
                    {
                        LogError("Invalid packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    /*Codes_SRS_MQTT_CLIENT_07_029: [If the actionResult parameter are of types PUBACK_TYPE, PUBREC_TYPE, PUBREL_TYPE or PUBCOMP_TYPE then the msgInfo value shall be a PUBLISH_ACK structure.]*/
                    MQTT_CLIENT_EVENT_RESULT action = (packet == PUBACK_TYPE) ? MQTT_CLIENT_ON_PUBLISH_ACK :
                        (packet == PUBREC_TYPE) ? MQTT_CLIENT_ON_PUBLISH_RECV :
                        (packet == PUBREL_TYPE) ? MQTT_CLIENT_ON_PUBLISH_REL : MQTT_CLIENT_ON_PUBLISH_COMP;

                    PUBLISH_ACK publish_ack = { 0 };
                    publish_ack.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("%s | PACKET_ID: %"PRIu16, packet == PUBACK_TYPE ? "PUBACK" : (packet == PUBREC_TYPE) ? "PUBREC" : (packet == PUBREL_TYPE) ? "PUBREL" : "PUBCOMP",
                            publish_ack.packetId);

                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    BUFFER_HANDLE pubRel = NULL;
                    mqtt_client->fnOperationCallback(mqtt_client, action, (void*)&publish_ack, mqtt_client->ctx);
                    if (packet == PUBREC_TYPE)
                    {
                        pubRel = mqtt_codec_publishRelease(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish release message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    else if (packet == PUBREL_TYPE)
                    {
                        pubRel = mqtt_codec_publishComplete(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish complete message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    if (pubRel != NULL)
                    {
                        size_t size = BUFFER_length(pubRel);
                        if (sendPacketItem(mqtt_client, BUFFER_u_char(pubRel), size) != 0)
                        {
                            LogError("Failed sending publish reply.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        }
                        BUFFER_delete(pubRel);
                    }
                    break;
                }
                case SUBACK_TYPE:
                {

                    /*Codes_SRS_MQTT_CLIENT_07_030: [If the actionResult parameter is of type SUBACK_TYPE then the msgInfo value shall be a SUBSCRIBE_ACK structure.]*/
                    SUBSCRIBE_ACK suback = { 0 };

                    size_t remainLen = packetLength;
                    suback.packetId = byteutil_read_uint16(&iterator, packetLength);
                    remainLen -= 2;

#ifndef NO_LOGGING
                    STRING_HANDLE trace_log = NULL;
                    if (is_trace_enabled(mqtt_client))
                    {
                        trace_log = STRING_construct_sprintf("SUBACK | PACKET_ID: %"PRIu16, suback.packetId);
                    }
#endif
                    // Allocate the remaining len
                    size_t malloc_size = safe_multiply_size_t(sizeof(QOS_VALUE), remainLen);
                    if (malloc_size != SIZE_MAX && 
                        (suback.qosReturn = (QOS_VALUE*)malloc(malloc_size)) != NULL)
                    {
                        while (remainLen > 0)
                        {
                            uint8_t qosRet = byteutil_readByte(&iterator);
                            if (qosRet & 0x7C) // SUBACK QOS bits 6-2 must be zero
                            {
                                LogError("Invalid SUBACK_TYPE packet.");
                                set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                                break;
                            }
                            suback.qosReturn[suback.qosCount++] =
                                (qosRet <= ((uint8_t)DELIVER_EXACTLY_ONCE)) ?
                                (QOS_VALUE)qosRet :  DELIVER_FAILURE;
                            remainLen--;
#ifndef NO_LOGGING
                            if (is_trace_enabled(mqtt_client))
                            {
                                STRING_sprintf(trace_log, " | RETURN_CODE: %"PRIu16, suback.qosReturn[suback.qosCount-1]);
                            }
#endif
                        }

#ifndef NO_LOGGING
                        if (is_trace_enabled(mqtt_client))
                        {
                            log_incoming_trace(mqtt_client, trace_log);
                            STRING_delete(trace_log);
                        }
#endif
                        mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_SUBSCRIBE_ACK, (void*)&suback, mqtt_client->ctx);
                        free(suback.qosReturn);
                    }
                    else
                    {
                        LogError("allocation of quality of service value failed, size:%zu", malloc_size);
                        set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                    }
                    break;
                }
                case UNSUBACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_031: [If the actionResult parameter is of type UNSUBACK_TYPE then the msgInfo value shall be a UNSUBSCRIBE_ACK structure.]*/
                    UNSUBSCRIBE_ACK unsuback = { 0 };
                    if (packetLength != 2) // UNSUBACK_TYPE payload must be only 2 bytes
                    {
                        LogError("Invalid UNSUBACK packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    unsuback.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %"PRIu16, unsuback.packetId);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_UNSUBSCRIBE_ACK, (void*)&unsuback, mqtt_client->ctx);
                    break;
                }
                case PINGRESP_TYPE:
                    mqtt_client->timeSincePing = 0;
#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("PINGRESP");
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    // Forward ping response to operation callback
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_PING_RESPONSE, NULL, mqtt_client->ctx);
                    break;
                default:
                    break;
            }
        }
    }
    else
    {
        LogError("recvCompleteCallback context failed.");
    }
}